

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchMark.cpp
# Opt level: O0

void runBenchMarkWrapper(int howmany,int thread_count)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  int local_114;
  string local_110;
  duration<double,_std::ratio<1L,_1L>_> local_f0;
  rep_conflict local_e8;
  rep_conflict delta_d;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d8;
  type delta;
  thread *t_1;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  int *local_a8;
  thread local_a0;
  int local_94;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_90;
  int t;
  time_point start;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined1 local_68 [4];
  atomic<int> msg_counter;
  __type local_38;
  string local_30;
  int local_10;
  int local_c;
  int thread_count_local;
  int howmany_local;
  
  local_10 = thread_count;
  local_c = howmany;
  std::operator<<((ostream *)&std::cout,"\n\n");
  std::operator<<((ostream *)&std::cout,
                  "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n"
                 );
  poVar2 = std::operator<<((ostream *)&std::cout,"Wrapper Mode (Rotating mode MT). queue_size = ");
  local_38 = std::pow<int,int>(2,0x14);
  utils::format<double>(&local_30,&local_38);
  poVar2 = std::operator<<(poVar2,(string *)&local_30);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_30);
  std::operator<<((ostream *)&std::cout,
                  "*******************************************************************************\n"
                 );
  std::operator<<((ostream *)&std::cout,
                  "\n*******************************************************************************\n"
                 );
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_10);
  poVar2 = std::operator<<(poVar2," threads sharing same logger, ");
  utils::format<int>((string *)local_68,&local_c);
  poVar2 = std::operator<<(poVar2,(string *)local_68);
  poVar2 = std::operator<<(poVar2," iterations");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_68);
  std::operator<<((ostream *)&std::cout,
                  "*******************************************************************************\n"
                 );
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<spdlog::level::level_enum>_>_>
           ::operator->(&logLevel_abi_cxx11_);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)ppVar3);
  poVar2 = std::operator<<(poVar2,"...\t\t");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  memset((void *)((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,4);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&start);
  tStack_90.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_94 = 0; local_94 < local_10; local_94 = local_94 + 1) {
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)
               ((long)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 4);
    local_a8 = &local_c;
    std::thread::thread<runBenchMarkWrapper(int,int)::__0,,void>(&local_a0,(type *)&__range1);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)&start,&local_a0);
    std::thread::~thread(&local_a0);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&start);
  t_1 = (thread *)
        std::vector<std::thread,_std::allocator<std::thread>_>::end
                  ((vector<std::thread,_std::allocator<std::thread>_> *)&start);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&t_1);
    if (!bVar1) break;
    delta.__r = (rep)__gnu_cxx::
                     __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                     ::operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  delta_d = (rep_conflict)std::chrono::_V2::system_clock::now();
  local_d8.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&delta_d,&stack0xffffffffffffff70);
  local_f0.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           (&local_d8);
  local_e8 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_f0);
  local_114 = (int)((double)local_c / local_e8);
  utils::format<int>(&local_110,&local_114);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_110);
  poVar2 = std::operator<<(poVar2,"/sec");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator<<((ostream *)&std::cout,
                  "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n"
                 );
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&start);
  return;
}

Assistant:

void runBenchMarkWrapper(int howmany, int thread_count) {
    cout << "\n\n";
    cout << "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
    cout << "Wrapper Mode (Rotating mode MT). queue_size = " << format(std::pow(2, 20)) << "\n";
    cout << "*******************************************************************************\n";
    cout << "\n*******************************************************************************\n";
    cout << thread_count << " threads sharing same logger, " << format(howmany) << " iterations" << endl;
    cout << "*******************************************************************************\n";
    cout << logLevel->first << "...\t\t" << flush;
    std::atomic<int> msg_counter{0};
    vector<thread> threads;
    auto start = system_clock::now();
    for (int t = 0; t < thread_count; ++t)
    {
        threads.push_back(std::thread([&]() {
            for (;;)
            {
                int counter = ++msg_counter;
                if (counter > howmany)
                    break;
                BENChMARK_LOG("Hello logger: msg number {}", counter);
            }
        }));
    }

    for (auto &t : threads)
    {
        t.join();
    };

    auto delta = system_clock::now() - start;
    auto delta_d = duration_cast<duration<double>>(delta).count();
    cout << format(int(howmany / delta_d)) << "/sec" << endl;
    cout << "+++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
}